

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection1.c
# Opt level: O0

int ssh1_rportfwd_cmp(void *av,void *bv)

{
  int iVar1;
  int i;
  ssh_rportfwd *b;
  ssh_rportfwd *a;
  void *bv_local;
  void *av_local;
  
  iVar1 = strcmp(*(char **)((long)av + 0x10),*(char **)((long)bv + 0x10));
  if (iVar1 == 0) {
    if (*(uint *)((long)bv + 4) < *(uint *)((long)av + 4)) {
      av_local._4_4_ = 1;
    }
    else if (*(uint *)((long)av + 4) < *(uint *)((long)bv + 4)) {
      av_local._4_4_ = -1;
    }
    else {
      av_local._4_4_ = 0;
    }
  }
  else {
    av_local._4_4_ = 1;
    if (iVar1 < 0) {
      av_local._4_4_ = -1;
    }
  }
  return av_local._4_4_;
}

Assistant:

static int ssh1_rportfwd_cmp(void *av, void *bv)
{
    struct ssh_rportfwd *a = (struct ssh_rportfwd *) av;
    struct ssh_rportfwd *b = (struct ssh_rportfwd *) bv;
    int i;
    if ( (i = strcmp(a->dhost, b->dhost)) != 0)
        return i < 0 ? -1 : +1;
    if (a->dport > b->dport)
        return +1;
    if (a->dport < b->dport)
        return -1;
    return 0;
}